

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::generateShuffledRamp
               (int numElements,vector<int,_std::allocator<int>_> *ramp)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  ulong uVar1;
  ulong uVar2;
  Random rng;
  deRandom dStack_28;
  
  deRandom_init(&dStack_28,0xabcd);
  std::vector<int,_std::allocator<int>_>::resize(ramp,(long)numElements);
  first._M_current =
       (ramp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  uVar1 = 0;
  uVar2 = (ulong)(uint)numElements;
  if (numElements < 1) {
    uVar2 = uVar1;
  }
  while (uVar2 != uVar1) {
    first._M_current[uVar1] = (int)(uVar1 + 1);
    uVar1 = uVar1 + 1;
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&dStack_28,first,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (ramp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish);
  return;
}

Assistant:

void generateShuffledRamp (int numElements, std::vector<int>& ramp)
{
	de::Random rng(0xabcd);

	// some positive (non-zero) unique values
	ramp.resize(numElements);
	for (int callNdx = 0; callNdx < numElements; ++callNdx)
		ramp[callNdx] = callNdx + 1;

	rng.shuffle(ramp.begin(), ramp.end());
}